

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O0

void __thiscall
ASDCP::KLVPacket::Dump(KLVPacket *this,FILE *stream,Dictionary *Dict,bool show_value)

{
  uchar *puVar1;
  bool bVar2;
  char *pcVar3;
  MDDEntry *pMVar4;
  unsigned_long_long uVar5;
  char *local_e0;
  MDDEntry *Entry;
  undefined1 local_88 [8];
  UL TmpUL;
  char buf [64];
  bool show_value_local;
  Dictionary *Dict_local;
  FILE *stream_local;
  KLVPacket *this_local;
  
  Dict_local = (Dictionary *)stream;
  if (stream == (FILE *)0x0) {
    Dict_local = _stderr;
  }
  if (this->m_KeyStart == (byte_t *)0x0) {
    bVar2 = Kumu::Identifier<16U>::HasValue(&(this->m_UL).super_Identifier<16U>);
    if (bVar2) {
      pcVar3 = UL::EncodeString(&this->m_UL,(char *)(TmpUL.super_Identifier<16U>.m_Value + 0xf),0x40
                               );
      fprintf((FILE *)Dict_local,"%s\n",pcVar3);
    }
    else {
      fprintf((FILE *)Dict_local,"*** Malformed KLV packet ***\n");
    }
  }
  else {
    UL::UL((UL *)local_88,this->m_KeyStart);
    pcVar3 = UL::EncodeString((UL *)local_88,(char *)(TmpUL.super_Identifier<16U>.m_Value + 0xf),
                              0x40);
    fprintf((FILE *)Dict_local,"%s",pcVar3);
    pMVar4 = Dictionary::FindULAnyVersion(Dict,this->m_KeyStart);
    if (pMVar4 == (MDDEntry *)0x0) {
      local_e0 = "Unknown";
    }
    else {
      local_e0 = pMVar4->name;
    }
    fprintf((FILE *)Dict_local,"  len: %7llu (%s)\n",this->m_ValueLength,local_e0);
    if (((this->m_ValueStart != (byte_t *)0x0) && (show_value)) && (this->m_ValueLength < 1000)) {
      puVar1 = this->m_ValueStart;
      uVar5 = Kumu::xmin<unsigned_long_long>(this->m_ValueLength,0x80);
      Kumu::hexdump(puVar1,(uint)uVar5,(_IO_FILE *)Dict_local);
    }
    UL::~UL((UL *)local_88);
  }
  return;
}

Assistant:

void
ASDCP::KLVPacket::Dump(FILE* stream, const Dictionary& Dict, bool show_value)
{
  char buf[64];

  if ( stream == 0 )
    stream = stderr;

  if ( m_KeyStart != 0 )
    {
      UL TmpUL(m_KeyStart);
      fprintf(stream, "%s", TmpUL.EncodeString(buf, 64));

      const MDDEntry* Entry = Dict.FindULAnyVersion(m_KeyStart);
      fprintf(stream, "  len: %7llu (%s)\n", m_ValueLength, (Entry ? Entry->name : "Unknown"));

      if ( m_ValueStart && show_value && m_ValueLength < 1000 )
	Kumu::hexdump(m_ValueStart, Kumu::xmin(m_ValueLength, (ui64_t)128), stream);
    }
  else if ( m_UL.HasValue() )
    {
      fprintf(stream, "%s\n", m_UL.EncodeString(buf, 64));
    }
  else
    {
      fprintf(stream, "*** Malformed KLV packet ***\n");
    }
}